

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# input_wrapper.h
# Opt level: O2

void __thiscall
date::iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::iterator_proxy
          (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *this,
          istreambuf_iterator<char,_std::char_traits<char>_> *srcIt,
          istreambuf_iterator<char,_std::char_traits<char>_> *srcEnd,value_type *cache,
          size_t *cacheSize)

{
  value_type *pvVar1;
  size_t sVar2;
  bool bVar3;
  int_type iVar4;
  istreambuf_iterator<char,_std::char_traits<char>_> iVar5;
  istreambuf_iterator<char,_std::char_traits<char>_> local_20;
  
  this->m_srcIt = srcIt;
  this->m_srcEnd = srcEnd;
  this->m_cache = cache;
  this->m_cacheSize = cacheSize;
  bVar3 = std::istreambuf_iterator<char,_std::char_traits<char>_>::equal(srcIt,srcEnd);
  this->m_position = -(ulong)bVar3;
  if (!bVar3) {
    iVar5 = std::istreambuf_iterator<char,_std::char_traits<char>_>::operator++(srcIt,0);
    local_20._M_sbuf = iVar5._M_sbuf;
    local_20._M_c = iVar5._M_c;
    iVar4 = std::istreambuf_iterator<char,_std::char_traits<char>_>::_M_get(&local_20);
    pvVar1 = this->m_cache;
    sVar2 = *this->m_cacheSize;
    *this->m_cacheSize = sVar2 + 1;
    pvVar1[sVar2] = (value_type)iVar4;
  }
  return;
}

Assistant:

iterator_proxy(Iterator& srcIt, const Iterator& srcEnd, value_type* cache, std::size_t& cacheSize)
        : m_srcIt(srcIt)
        , m_srcEnd(srcEnd)
        , m_cache(cache)
        , m_cacheSize(cacheSize)
        , m_position((srcIt == srcEnd) ? static_cast<std::size_t>(-1) : 0)
    {
        if (m_position != static_cast<std::size_t>(-1))
            m_cache[m_cacheSize++] = *(srcIt++);
    }